

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBucket.cpp
# Opt level: O2

void __thiscall
Memory::
SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
::SweepPartialReusePages
          (SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
           *this,RecyclerSweep *recyclerSweep)

{
  SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> **reuseBlocklist;
  SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *pSVar1;
  code *pcVar2;
  anon_class_56_6_5a5016e3 fn;
  bool bVar3;
  uint uVar4;
  Recycler *pRVar5;
  undefined4 *puVar6;
  BucketData<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_> *pBVar7;
  undefined7 uStack_47;
  
  bVar3 = RecyclerSweep::IsBackground(recyclerSweep);
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
  VerifyHeapBlockCount
            (&this->
              super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
             ,bVar3);
  pRVar5 = HeapBucket::GetRecycler((HeapBucket *)this);
  if (pRVar5->inPartialCollectMode == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x1ae,"(this->GetRecycler()->inPartialCollectMode)",
                       "this->GetRecycler()->inPartialCollectMode");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  reuseBlocklist =
       &(this->
        super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
        ).heapBlockList;
  pSVar1 = (this->
           super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
           ).heapBlockList;
  (this->
  super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>).
  heapBlockList = (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
  bVar3 = HeapBucket::AllocationsStartedDuringConcurrentSweep((HeapBucket *)this);
  SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
  ::
  SweepPartialReusePages<Memory::SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>::SweepPartialReusePages(Memory::RecyclerSweep&)::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*,bool)_1_>
            ((SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
              *)this,recyclerSweep,pSVar1,reuseBlocklist,&this->partialHeapBlockList,bVar3,
             (anon_class_8_1_8991fb9c_for_callback)this);
  uVar4 = HeapBucket::GetBucketIndex((HeapBucket *)this);
  pBVar7 = (recyclerSweep->withBarrierData).bucketData + uVar4;
  pSVar1 = pBVar7->pendingSweepList;
  pBVar7->pendingSweepList = (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0
  ;
  pRVar5 = RecyclerSweep::GetRecycler(recyclerSweep);
  bVar3 = HeapBucket::AllocationsStartedDuringConcurrentSweep((HeapBucket *)this);
  fn._41_7_ = uStack_47;
  fn.allocationsAllowedDuringConcurrentSweep = bVar3;
  fn.reuseBlocklist = reuseBlocklist;
  fn.recyclerSweep = recyclerSweep;
  fn.unusedBlockList = &pBVar7->pendingSweepList;
  fn.callback.this = this;
  fn.callback.recycler = pRVar5;
  fn.this = this;
  HeapBlockList::
  ForEachEditing<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>,Memory::SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>::SweepPartialReusePages<Memory::SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>::SweepPartialReusePages(Memory::RecyclerSweep&)::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*,bool)_2_>(Memory::RecyclerSweep&,Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*,Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*&,Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*&,bool,Memory::SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>::SweepPartialReusePages(Memory::RecyclerSweep&)::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*,bool)_2_)::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            (pSVar1,fn);
  bVar3 = RecyclerSweep::IsBackground(recyclerSweep);
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
  VerifyHeapBlockCount
            (&this->
              super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
             ,bVar3);
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
  StartAllocationAfterSweep
            (&this->
              super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
            );
  return;
}

Assistant:

void
SmallNormalHeapBucketBase<TBlockType>::SweepPartialReusePages(RecyclerSweep& recyclerSweep)
{
    RECYCLER_SLOW_CHECK(this->VerifyHeapBlockCount(recyclerSweep.IsBackground()));
    Assert(this->GetRecycler()->inPartialCollectMode);

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP && SUPPORT_WIN32_SLIST
    if (this->AllowAllocationsDuringConcurrentSweep() && !this->AllocationsStartedDuringConcurrentSweep())
    {
        Assert(!this->IsAnyFinalizableBucket());
        this->StartAllocationDuringConcurrentSweep();
    }
#endif

    TBlockType * currentHeapBlockList = this->heapBlockList;
    this->heapBlockList = nullptr;
    SmallNormalHeapBucketBase<TBlockType>::SweepPartialReusePages(recyclerSweep, currentHeapBlockList, this->heapBlockList,
        this->partialHeapBlockList, this->AllocationsStartedDuringConcurrentSweep(),
        [this](TBlockType * heapBlock, bool isReused) 
    {
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP && SUPPORT_WIN32_SLIST
        if (isReused)
        {
            DebugOnly(heapBlock->blockNotReusedInPartialHeapBlockList = false);

            DebugOnly(this->AssertCheckHeapBlockNotInAnyList(heapBlock));
            if (heapBlock->HasFreeObject())
            {
                if (this->AllocationsStartedDuringConcurrentSweep())
                {
                    Assert(!this->IsAnyFinalizableBucket());
                    Assert(!heapBlock->isPendingConcurrentSweepPrep);
                    bool blockAddedToSList = HeapBucketT<TBlockType>::PushHeapBlockToSList(this->allocableHeapBlockListHead, heapBlock);

                    // If we encountered OOM while pushing the heapBlock to the SLIST we must add it to the heapBlockList so we don't lose track of it.
                    if (!blockAddedToSList)
                    {
                        //TODO: akatti: We should handle this gracefully and try to recover from this state.
                        AssertOrFailFastMsg(false, "OOM while adding a heap block to the SLIST during concurrent sweep.");
                    }
#ifdef RECYCLER_TRACE
                    else
                    {
                        this->GetRecycler()->PrintBlockStatus(this, heapBlock, _u("[**11**] finished SweepPartialReusePages, heapblock REUSED added to SLIST allocableHeapBlockListHead."));
                    }
#endif
                }
            }
            else
            {
                heapBlock->SetNextBlock(this->fullBlockList);
                this->fullBlockList = heapBlock;
#ifdef RECYCLER_TRACE
                this->GetRecycler()->PrintBlockStatus(this, heapBlock, _u("[**27**] finished SweepPartialReusePages, heapblock FULL added to fullBlockList."));
#endif
            }
        }
        else
        {
            DebugOnly(heapBlock->blockNotReusedInPartialHeapBlockList = true);
#ifdef RECYCLER_TRACE
            this->GetRecycler()->PrintBlockStatus(this, heapBlock, _u("[**12**] finished SweepPartialReusePages, heapblock NOT REUSED, added to partialHeapBlockList."));
#endif

#if DBG || defined(RECYCLER_SLOW_CHECK_ENABLED)
            if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc))
            {
                heapBlock->ResetConcurrentSweepAllocationCounts();
            }
#endif
        }
#endif
    });

#if ENABLE_CONCURRENT_GC
    // only collect data for pending sweep list but don't sweep yet
    // until we have adjusted the heuristics, and SweepPartialReusePages will
    // sweep the page that we are going to reuse in thread.
    TBlockType *& pendingSweepList = recyclerSweep.GetPendingSweepBlockList(this);
    currentHeapBlockList = pendingSweepList;
    pendingSweepList = nullptr;
    Recycler * recycler = recyclerSweep.GetRecycler();
    SmallNormalHeapBucketBase<TBlockType>::SweepPartialReusePages(recyclerSweep, currentHeapBlockList, this->heapBlockList,
        pendingSweepList, this->AllocationsStartedDuringConcurrentSweep(),
        [this, recycler](TBlockType * heapBlock, bool isReused)
        {
            if (isReused)
            {
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
                DebugOnly(heapBlock->blockNotReusedInPendingList = false);
#endif
                // Finalizable blocks are always swept in thread, so shouldn't be here
                Assert(!heapBlock->IsAnyFinalizableBlock());

                // Page heap blocks are never swept concurrently
#ifdef RECYCLER_TRACE
                recycler->PrintBlockStatus(this, heapBlock, _u("[**20**] calling SweepObjects."));
#endif
                heapBlock->template SweepObjects<SweepMode_InThread>(recycler);
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP && SUPPORT_WIN32_SLIST
                DebugOnly(this->AssertCheckHeapBlockNotInAnyList(heapBlock));
                if (heapBlock->HasFreeObject())
                {
                    if (this->AllocationsStartedDuringConcurrentSweep())
                    {
                        Assert(!this->IsAnyFinalizableBucket());
                        Assert(!heapBlock->isPendingConcurrentSweepPrep);
                        bool blockAddedToSList = HeapBucketT<TBlockType>::PushHeapBlockToSList(this->allocableHeapBlockListHead, heapBlock);

                        // If we encountered OOM while pushing the heapBlock to the SLIST we must add it to the heapBlockList so we don't lose track of it.
                        if (!blockAddedToSList)
                        {
                            //TODO: akatti: We should handle this gracefully and try to recover from this state.
                            AssertOrFailFastMsg(false, "OOM while adding a heap block to the SLIST during concurrent sweep.");
                        }
#ifdef RECYCLER_TRACE
                        else
                        {
                            this->GetRecycler()->PrintBlockStatus(this, heapBlock, _u("[**14**] finished SweepPartialReusePages, heapblock from PendingSweepList REUSED added to SLIST allocableHeapBlockListHead."));
                        }
#endif
                    }
                }
                else
                {
                    heapBlock->SetNextBlock(this->fullBlockList);
                    this->fullBlockList = heapBlock;
#ifdef RECYCLER_TRACE
                    this->GetRecycler()->PrintBlockStatus(this, heapBlock, _u("[**28**] finished SweepPartialReusePages, heapblock FULL added to fullBlockList."));
#endif
                }
#endif

                // This block has been counted as concurrently swept, and now we changed our mind
                // and sweep it in thread. Remove the count
                RECYCLER_STATS_DEC(recycler, heapBlockConcurrentSweptCount[heapBlock->GetHeapBlockType()]);
            }
            else
            {
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
                DebugOnly(heapBlock->blockNotReusedInPendingList = true);
#endif
#ifdef RECYCLER_TRACE
                this->GetRecycler()->PrintBlockStatus(this, heapBlock, _u("[**15**] finished SweepPartialReusePages, heapblock NOT REUSED added to pendingSweepList."));
#endif
            }
        }
    );
#endif

    RECYCLER_SLOW_CHECK(this->VerifyHeapBlockCount(recyclerSweep.IsBackground()));

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP && SUPPORT_WIN32_SLIST
    if (!this->AllocationsStartedDuringConcurrentSweep())
#endif
    {
        this->StartAllocationAfterSweep();
    }

    // PARTIALGC-TODO: revisit partial heap blocks to see if they can be put back into use
    // since the heuristics limit may be been changed.
}